

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O2

void __thiscall
avro::BufferCopyInInputStream::BufferCopyInInputStream
          (BufferCopyInInputStream *this,auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *in,
          size_t bufferSize)

{
  BufferCopyIn *pBVar1;
  uint8_t *puVar2;
  
  (this->super_InputStream)._vptr_InputStream = (_func_int **)&PTR__BufferCopyInInputStream_001a37c0
  ;
  this->bufferSize_ = bufferSize;
  puVar2 = (uint8_t *)operator_new__(bufferSize);
  this->buffer_ = puVar2;
  pBVar1 = in->_M_ptr;
  in->_M_ptr = (BufferCopyIn *)0x0;
  (this->in_)._M_ptr = pBVar1;
  this->byteCount_ = 0;
  this->next_ = puVar2;
  this->available_ = 0;
  return;
}

Assistant:

BufferCopyInInputStream(auto_ptr<BufferCopyIn>& in, size_t bufferSize) :
        bufferSize_(bufferSize),
        buffer_(new uint8_t[bufferSize]),
        in_(in),
        byteCount_(0),
        next_(buffer_),
        available_(0) { }